

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionCostCalculator.cpp
# Opt level: O1

tuple<int,_int,_int> __thiscall
multi_agent_planning::InteractionCostCalculator::getCostWithInteractions
          (InteractionCostCalculator *this,Edge edge,int time,int cost)

{
  int iVar1;
  pointer ptVar2;
  int iVar3;
  mapped_type *pmVar4;
  _Rb_tree_color in_ECX;
  int iVar5;
  _Head_base<0UL,_int,_false> _Var6;
  pointer ptVar7;
  undefined4 in_register_00000034;
  tuple<int,_int,_int> tVar8;
  
  pmVar4 = std::
           map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>_>_>
           ::at((map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>_>_>
                 *)CONCAT44(in_register_00000034,time),&edge);
  ptVar7 = (pmVar4->
           super__Vector_base<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ptVar2 = (pmVar4->
           super__Vector_base<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar7 == ptVar2) {
    iVar3 = 0;
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    iVar3 = 0;
    do {
      if ((ptVar7->super__Tuple_impl<0UL,_int,_multi_agent_planning::PlannedAction,_int>).
          super__Tuple_impl<1UL,_multi_agent_planning::PlannedAction,_int>.
          super__Head_base<1UL,_multi_agent_planning::PlannedAction,_false>._M_head_impl.start_time
          == cost) {
        iVar1 = (ptVar7->super__Tuple_impl<0UL,_int,_multi_agent_planning::PlannedAction,_int>).
                super__Tuple_impl<1UL,_multi_agent_planning::PlannedAction,_int>.
                super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
        iVar3 = iVar3 + (uint)(0 < iVar1);
        iVar5 = iVar5 + (uint)(0 < (int)in_ECX && iVar1 < 1);
        in_ECX = (_Rb_tree_color)
                 ((float)(int)in_ECX +
                 (float)iVar1 *
                 *(float *)&((map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>_>_>
                              *)CONCAT44(in_register_00000034,time))[1]._M_t._M_impl);
      }
      ptVar7 = ptVar7 + 1;
    } while (ptVar7 != ptVar2);
  }
  _Var6._M_head_impl = _S_red;
  if (0 < (int)in_ECX) {
    _Var6._M_head_impl = in_ECX;
  }
  *(int *)&(this->interactionMap)._M_t._M_impl = iVar5;
  *(int *)&(this->interactionMap)._M_t._M_impl.field_0x4 = iVar3;
  (this->interactionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _Var6._M_head_impl;
  tVar8.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       _Var6._M_head_impl;
  tVar8.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> =
       (_Tuple_impl<1UL,_int,_int>)this;
  return (tuple<int,_int,_int>)tVar8.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

std::tuple<int, int, int> InteractionCostCalculator::getCostWithInteractions(Edge edge, int time, int cost) const {

	int inter_dependent_cost = cost;
	int num_conflicts = 0;
	int num_synergies = 0;

	try {
		const PlannedActionList& interactions = interactionMap.at(edge);

		for (auto const& i : interactions) {
			if (get<1>(i).start_time == time) {

				if (get<2>(i) > 0) {
					num_conflicts++;
				}
				else if (inter_dependent_cost > 0) {
					num_synergies++;
				}

				inter_dependent_cost += get<2>(i) * alpha;
			}
		}
	}
	catch (std::out_of_range) {}

	if (inter_dependent_cost < 0) {
		inter_dependent_cost = 0;
	}

	return make_tuple(inter_dependent_cost, num_conflicts, num_synergies);
}